

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_helpers.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::java::GenerateGetBitMutableLocal_abi_cxx11_
          (string *__return_storage_ptr__,java *this,int bitIndex)

{
  allocator local_39;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_38,"mutable_",&local_39);
  anon_unknown_0::GenerateGetBitInternal(__return_storage_ptr__,&local_38,(int)this);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

string GenerateGetBitMutableLocal(int bitIndex) {
  return GenerateGetBitInternal("mutable_", bitIndex);
}